

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O1

bool __thiscall glslang::TConstUnionArray::operator==(TConstUnionArray *this,TConstUnionArray *rhs)

{
  TConstUnionVector *pTVar1;
  TConstUnionVector *pTVar2;
  TConstUnion *pTVar3;
  bool bVar4;
  TConstUnion *this_00;
  TConstUnion *constant;
  
  pTVar1 = this->unionArray;
  pTVar2 = rhs->unionArray;
  if (pTVar1 == pTVar2) {
    return true;
  }
  if (pTVar2 == (TConstUnionVector *)0x0 || pTVar1 == (TConstUnionVector *)0x0) {
    return false;
  }
  this_00 = (pTVar1->
            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (pTVar1->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  constant = (pTVar2->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pTVar3 - (long)this_00 ==
      (long)(pTVar2->
            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)constant) {
    if (this_00 == pTVar3) {
      return this_00 == pTVar3;
    }
    bVar4 = TConstUnion::operator==(this_00,constant);
    if (bVar4) {
      do {
        constant = constant + 1;
        this_00 = this_00 + 1;
        if (this_00 == pTVar3) {
          return this_00 == pTVar3;
        }
        bVar4 = TConstUnion::operator==(this_00,constant);
      } while (bVar4);
      return false;
    }
  }
  return false;
}

Assistant:

bool operator==(const TConstUnionArray& rhs) const
    {
        // this includes the case that both are unallocated
        if (unionArray == rhs.unionArray)
            return true;

        if (! unionArray || ! rhs.unionArray)
            return false;

        return *unionArray == *rhs.unionArray;
    }